

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O2

void __thiscall
libsgp4::SGP4::DeepSpaceInitialise
          (SGP4 *this,double eosq,double sinio,double cosio,double betao,double theta2,double betao2
          ,double xmdot,double omgdot,double xnodot)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double local_268;
  double dStack_260;
  double local_238;
  double dStack_230;
  double local_1f8;
  double local_1a8;
  double local_198;
  
  dVar2 = 1.0 / *(double *)(this + 0x2a0);
  dVar3 = sin(*(double *)(this + 0x270));
  dVar4 = cos(*(double *)(this + 0x270));
  dVar5 = sin(*(double *)(this + 0x278));
  dVar6 = cos(*(double *)(this + 0x278));
  dVar14 = (double)*(long *)(this + 0x2c0) / 86400000000.0 + 1721425.5 + -2415020.0;
  dVar18 = dVar14 * -0.00092422029 + 4.523602;
  dVar7 = floor(dVar18 / 6.283185307179586);
  dVar18 = dVar7 * -6.283185307179586 + dVar18;
  dVar7 = sin(dVar18);
  dVar8 = cos(dVar18);
  dVar15 = dVar8 * -0.03568096 + 0.91375164;
  dVar9 = 1.0 - dVar15 * dVar15;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar16 = (dVar7 * 0.089683511) / dVar9;
  dVar10 = 1.0 - dVar16 * dVar16;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar17 = dVar14 * 0.001944368 + 5.8351514;
  dVar19 = (dVar14 * 0.2299715 + 4.7199672) - dVar17;
  dVar11 = floor(dVar19 / 6.283185307179586);
  *(double *)(this + 0xd8) = dVar11 * -6.283185307179586 + dVar19;
  dVar7 = atan2((dVar7 * 0.39785416) / dVar9,dVar8 * dVar10 + dVar16 * 0.91744867 * dVar7);
  dVar18 = (dVar7 + dVar17) - dVar18;
  dVar12 = cos(dVar18);
  dVar13 = sin(dVar18);
  dVar7 = dVar14 * 0.017201977 + 6.2565837;
  dVar8 = floor(dVar7 / 6.283185307179586);
  *(double *)(this + 0xe0) = dVar8 * -6.283185307179586 + dVar7;
  dVar7 = *(double *)(this + 0x2a8);
  bVar1 = false;
  local_1f8 = 2.9864797e-06;
  local_1a8 = 1.19459e-05;
  local_198 = 0.01675;
  dVar8 = 0.91744867;
  dVar18 = dVar3;
  dVar14 = dVar4;
  dVar11 = 0.39785416;
  dVar17 = -0.98088458;
  dVar19 = 0.1945905;
  while( true ) {
    dVar33 = dVar19 * dVar14 + dVar18 * dVar8 * dVar17;
    dVar34 = -dVar17 * dVar14 + dVar18 * dVar8 * dVar19;
    dVar40 = -dVar19 * dVar18 + dVar14 * dVar8 * dVar17;
    dVar8 = dVar17 * dVar18 + dVar14 * dVar8 * dVar19;
    dVar27 = cosio * dVar40 + dVar11 * dVar17 * sinio;
    dVar28 = cosio * dVar8 + dVar11 * dVar19 * sinio;
    dVar18 = dVar33 * dVar6 + dVar5 * dVar27;
    dVar35 = dVar6 * dVar27 - dVar33 * dVar5;
    dVar37 = dVar6 * dVar28 - dVar34 * dVar5;
    dVar41 = dVar40 * -sinio + dVar11 * dVar17 * cosio;
    dVar43 = dVar8 * -sinio + dVar11 * dVar19 * cosio;
    dVar19 = dVar6 * dVar41;
    dVar21 = dVar6 * dVar43;
    dVar44 = dVar43 * dVar5;
    dVar26 = dVar6 * dVar34 + dVar5 * dVar28;
    dVar8 = dVar41 * dVar5;
    dVar11 = dVar35 * -6.0;
    dVar29 = dVar18 * 12.0 * dVar18 + dVar35 * -3.0 * dVar35;
    dVar31 = dVar26 * 12.0 * dVar26 + dVar37 * -3.0 * dVar37;
    dVar42 = dVar18 * 24.0 * dVar26 + dVar11 * dVar37;
    dVar14 = (dVar33 * dVar34 + dVar28 * dVar27) * 6.0 + dVar42 * eosq;
    local_1f8 = local_1f8 * (1.0 / dVar7);
    dVar22 = dVar33 * -6.0 * dVar41 + (dVar18 * -24.0 * dVar19 + dVar8 * dVar11) * eosq;
    dVar24 = dVar34 * -6.0 * dVar43 + (dVar26 * -24.0 * dVar21 + dVar44 * dVar37 * -6.0) * eosq;
    dVar38 = (local_1f8 * -0.5) / betao;
    dVar25 = local_1f8 * betao;
    dVar45 = dVar27 * 6.0 * dVar41 + (dVar8 * dVar18 * 24.0 + dVar11 * dVar19) * eosq;
    dVar46 = dVar28 * 6.0 * dVar43 + (dVar26 * 24.0 * dVar44 + dVar37 * -6.0 * dVar21) * eosq;
    dVar11 = (dVar33 * dVar33 + dVar27 * dVar27) * 3.0 + dVar29 * eosq;
    dVar17 = (dVar34 * dVar34 + dVar28 * dVar28) * 3.0 + dVar31 * eosq;
    dVar11 = betao2 * dVar29 + dVar11 + dVar11;
    dVar17 = betao2 * dVar31 + dVar17 + dVar17;
    dVar40 = dVar25 * *(double *)(this + 0x280) * -15.0;
    dVar39 = 0.0;
    if (*(double *)(this + 0x288) <= 3.0892327765897933 && 0.052359877 <= *(double *)(this + 0x288))
    {
      dVar39 = ((dVar45 + dVar46) * -local_1a8 * dVar38) / sinio;
    }
    dVar36 = local_1a8 * dVar40 * (dVar18 * dVar35 + dVar37 * dVar26);
    dVar30 = local_1a8 * dVar38 * (dVar22 + dVar24);
    dVar32 = -local_1a8 * local_1f8 * (eosq * -6.0 + dVar11 + dVar17 + -14.0);
    dVar23 = local_1a8 * dVar25 * (dVar29 + dVar31 + -6.0);
    dVar20 = (dVar40 + dVar40) * (dVar37 * dVar18 + dVar26 * dVar35);
    dVar40 = (dVar40 + dVar40) * (-dVar18 * dVar35 + dVar26 * dVar37);
    local_1f8 = local_1f8 * -2.0;
    dVar17 = local_1f8 * (dVar17 - dVar11);
    dVar33 = ((dVar43 * dVar33 + dVar34 * dVar41) * -6.0 +
             ((dVar26 * dVar19 + dVar18 * dVar21) * -24.0 +
             (dVar35 * dVar44 + dVar8 * dVar37) * -6.0) * eosq) * dVar38 * 2.0;
    dVar11 = (dVar24 - dVar22) * dVar38 * 2.0;
    dVar14 = (betao2 * dVar42 + dVar14 + dVar14) * local_1f8;
    dVar22 = (dVar31 - dVar29) * dVar25 * 2.0;
    dVar24 = local_198 * dVar25 * -18.0;
    dVar42 = dVar25 * 2.0 * dVar42;
    dVar8 = dVar38 * -2.0 *
            ((dVar41 * dVar28 + dVar43 * dVar27) * 6.0 +
            eosq * ((dVar26 * dVar8 + dVar44 * dVar18) * 24.0 +
                   (dVar37 * dVar19 + dVar21 * dVar35) * -6.0));
    dVar18 = (dVar46 - dVar45) * dVar38 * -2.0;
    local_198 = local_198 * local_1f8 * (eosq * -9.0 + -21.0);
    if (bVar1) break;
    *(double *)(this + 0xe8) = dVar36;
    *(double *)(this + 0xf0) = dVar30;
    *(double *)(this + 0xf8) = dVar32;
    *(double *)(this + 0x108) = dVar39;
    *(double *)(this + 0x100) = dVar39 * -cosio + dVar23;
    *(double *)(this + 0x110) = dVar20;
    *(double *)(this + 0x118) = dVar33;
    *(double *)(this + 0x120) = dVar14;
    *(double *)(this + 0x128) = dVar42;
    *(double *)(this + 0x130) = dVar8;
    *(double *)(this + 0x138) = dVar40;
    *(double *)(this + 0x140) = dVar11;
    *(double *)(this + 0x148) = dVar17;
    *(double *)(this + 0x150) = dVar22;
    *(double *)(this + 0x158) = dVar18;
    *(double *)(this + 0x160) = local_198;
    *(double *)(this + 0x168) = dVar24;
    bVar1 = true;
    local_198 = 0.0549;
    local_1a8 = 0.00015835218;
    local_1f8 = 4.7968065e-07;
    dVar8 = dVar15;
    dVar18 = dVar10 * dVar3 + -dVar4 * dVar16;
    dVar14 = dVar10 * dVar4 + dVar3 * dVar16;
    dVar11 = dVar9;
    dVar17 = dVar13;
    dVar19 = dVar12;
  }
  *(double *)(this + 0x170) = dVar20;
  *(double *)(this + 0x178) = dVar40;
  *(double *)(this + 0x180) = dVar33;
  *(double *)(this + 0x188) = dVar11;
  *(double *)(this + 400) = dVar14;
  *(double *)(this + 0x198) = dVar17;
  *(double *)(this + 0x1a0) = local_198;
  *(double *)(this + 0x1a8) = dVar42;
  *(double *)(this + 0x1b0) = dVar22;
  *(double *)(this + 0x1b8) = dVar24;
  *(double *)(this + 0x1c0) = dVar8;
  *(double *)(this + 0x1c8) = dVar18;
  *(double *)(this + 0xe8) = dVar36 + *(double *)(this + 0xe8);
  dVar32 = dVar32 + *(double *)(this + 0xf8);
  *(double *)(this + 0xf0) = dVar30 + *(double *)(this + 0xf0);
  *(double *)(this + 0xf8) = dVar32;
  dVar3 = -cosio * dVar39 + dVar23 + *(double *)(this + 0x100);
  dVar39 = dVar39 + *(double *)(this + 0x108);
  *(double *)(this + 0x100) = dVar3;
  *(double *)(this + 0x108) = dVar39;
  *(undefined4 *)(this + 0x248) = 0;
  if ((0.0052359877 <= dVar7) || (dVar7 <= 0.0034906585)) {
    if (dVar7 < 0.00826) {
      return;
    }
    if (0.00924 < dVar7) {
      return;
    }
    dVar3 = *(double *)(this + 0x280);
    if (dVar3 < 0.5) {
      return;
    }
    *(undefined4 *)(this + 0x248) = 1;
    dVar5 = dVar3 * dVar3;
    dVar4 = dVar3 * dVar5;
    if (dVar3 <= 0.65) {
      local_268 = dVar4 * 156.591 + dVar5 * -228.419 + dVar3 * 117.39 + -19.302;
      dStack_260 = dVar4 * 146.5816 + dVar5 * -214.6334 + dVar3 * 109.7927 + -18.9068;
      dVar6 = dVar4 * 313.953 + dVar5 * -471.094 + dVar3 * 242.694 + -41.122;
      dVar8 = dVar4 * 1083.435 + dVar5 * -1629.014 + dVar3 * 841.88 + -146.407;
      dVar9 = dVar4 * 0.0 + dVar5 * 16.29 + dVar3 * -13.247 + 3.616;
      dVar18 = dVar4 * 3708.276 + dVar5 * -5740.032 + dVar3 * 3017.977 + -532.114;
    }
    else {
      dVar9 = dVar4 * 266.724 + dVar5 * -508.738 + dVar3 * 331.819 + -72.099;
      local_268 = dVar4 * 1246.113 + dVar5 * -2415.925 + dVar3 * 1582.851 + -346.844;
      dStack_260 = dVar4 * 1215.972 + dVar5 * -2366.899 + dVar3 * 1554.908 + -342.585;
      dVar6 = dVar4 * 3651.957 + dVar5 * -7193.992 + dVar3 * 4758.686 + -1052.797;
      dVar8 = dVar4 * 12422.52 + dVar5 * -24462.77 + dVar3 * 16178.11 + -3581.69;
      if (dVar3 <= 0.715) {
        dVar18 = dVar5 * 3763.64 + dVar3 * -4664.75 + 1464.74;
        dVar14 = 0.0;
      }
      else {
        dVar18 = dVar5 * -54087.36 + dVar3 * 29936.92 + -5149.66;
        dVar14 = 31324.56;
      }
      dVar18 = dVar14 * dVar4 + dVar18;
    }
    if (0.7 <= dVar3) {
      local_238 = dVar4 * 146349.42 + dVar5 * -309468.16 + dVar3 * 218913.95 + -51752.104;
      dStack_230 = dVar4 * 109377.94 + dVar5 * -229838.2 + dVar3 * 161616.52 + -37995.78;
      dVar5 = dVar5 * -242699.48 + dVar3 * 170470.89 + -40023.88;
      dVar4 = dVar4 * 115605.82;
    }
    else {
      local_238 = dVar4 * 5337.524 + dVar5 * -8491.4146 + dVar3 * 4568.6173 + -822.71072;
      dStack_230 = dVar4 * 5542.21 + dVar5 * -9064.77 + dVar3 * 4988.61 + -919.2277;
      dVar5 = dVar5 * -8624.77 + dVar3 * 4690.25 + -853.666;
      dVar4 = dVar4 * 5341.4;
    }
    dVar14 = cosio * -2.0 + 1.0;
    dVar15 = cosio * 2.0 + 1.0;
    dVar10 = dVar7 * dVar7 * 3.0 * dVar2 * dVar2;
    dVar16 = sinio * sinio;
    dVar17 = (dVar15 + theta2) * 0.75;
    dVar11 = dVar10 * 1.7891679e-06;
    dVar10 = dVar2 * dVar10;
    dVar19 = dVar2 * dVar10;
    dVar10 = dVar10 * 3.7393792e-07;
    *(double *)(this + 0x1d0) = ((dVar3 + -0.64) * -0.44 + -0.306) * dVar17 * dVar11;
    *(double *)(this + 0x1d8) = dVar9 * dVar11 * dVar16 * 1.5;
    dVar15 = theta2 * -3.0 + dVar15;
    *(double *)(this + 0x1e0) = dVar10 * sinio * 1.875 * (theta2 * -3.0 + dVar14) * local_268;
    *(double *)(this + 0x1e8) = dVar10 * sinio * -1.875 * dVar15 * dStack_260;
    dVar2 = dVar2 * dVar19;
    dVar3 = (dVar19 + dVar19) * 7.3636953e-09;
    *(double *)(this + 0x1f0) = dVar3 * dVar17 * dVar16 * 35.0 * dVar6;
    *(double *)(this + 0x1f8) = dVar3 * dVar16 * dVar16 * 39.375 * dVar8;
    *(double *)(this + 0x200) =
         dVar18 * dVar2 * 1.1428639e-07 *
                  sinio * 9.84375 *
                  (dVar16 * (theta2 * -5.0 + dVar14) +
                  (theta2 * 6.0 + cosio * 4.0 + -2.0) * 0.33333333);
    *(double *)(this + 0x208) =
         (dVar4 + dVar5) *
         dVar2 * 1.1428639e-07 *
         sinio * (dVar16 * 4.92187512 * (theta2 * 10.0 + cosio * -4.0 + -2.0) + dVar15 * 6.56250012)
    ;
    dVar2 = (dVar2 + dVar2) * 2.1765803e-09;
    *(double *)(this + 0x210) =
         dVar2 * sinio * 29.53125 *
                 ((theta2 * 10.0 + cosio * 8.0 + -12.0) * theta2 + cosio * -8.0 + 2.0) * local_238;
    *(double *)(this + 0x218) =
         dVar2 * sinio * 29.53125 *
                 ((theta2 * -10.0 + cosio * 8.0 + 12.0) * theta2 + cosio * -8.0 + -2.0) * dStack_230
    ;
    dVar3 = ((*(double *)(this + 0x268) + *(double *)(this + 0x270) + *(double *)(this + 0x270)) -
            *(double *)(this + 0xd0)) - *(double *)(this + 0xd0);
    dVar2 = floor(dVar3 / 6.283185307179586);
    *(double *)(this + 0x240) = dVar2 * -6.283185307179586 + dVar3;
    if (*(int *)(this + 0x248) == 0) {
      return;
    }
    dVar3 = dVar32 + xmdot + xnodot + xnodot + -0.0043752690880113 + -0.0043752690880113 + dVar39;
  }
  else {
    *(undefined4 *)(this + 0x248) = 2;
    dVar4 = cosio + 1.0;
    dVar5 = dVar7 * 3.0 * dVar7 * dVar2 * dVar2;
    *(double *)(this + 0x230) =
         dVar5 * 3.0 * dVar4 * 1.875 * dVar4 * dVar4 * ((eosq * 6.60937 + -6.0) * eosq + 1.0) *
         2.2123015e-07 * dVar2;
    *(double *)(this + 0x220) =
         dVar2 * ((cosio * 3.0 + 1.0) * sinio * 0.9375 * sinio - dVar4 * 0.75) * dVar5 *
                 (eosq + eosq + 1.0) * 2.1460748e-06;
    *(double *)(this + 0x228) =
         ((eosq * 0.8125 + -2.5) * eosq + 1.0) * dVar4 * dVar4 * 0.75 * (dVar5 + dVar5) *
         1.7891679e-06;
    dVar4 = (*(double *)(this + 0x268) + *(double *)(this + 0x270) + *(double *)(this + 0x278)) -
            *(double *)(this + 0xd0);
    dVar2 = floor(dVar4 / 6.283185307179586);
    *(double *)(this + 0x240) = dVar2 * -6.283185307179586 + dVar4;
    dVar3 = dVar32 + omgdot + xnodot + xmdot + -0.0043752690880113 + dVar3;
  }
  *(double *)(this + 0x238) = (dVar39 + dVar3) - dVar7;
  *(undefined8 *)(this + 0x260) = 0;
  *(double *)(this + 600) = dVar7;
  *(undefined8 *)(this + 0x250) = *(undefined8 *)(this + 0x240);
  return;
}

Assistant:

void SGP4::DeepSpaceInitialise(
        const double eosq,
        const double sinio,
        const double cosio,
        const double betao,
        const double theta2,
        const double betao2,
        const double xmdot,
        const double omgdot,
        const double xnodot)
{
    double se = 0.0;
    double si = 0.0;
    double sl = 0.0;
    double sgh = 0.0;
    double shdq = 0.0;

    double bfact = 0.0;

    static const double ZNS = 1.19459E-5;
    static const double C1SS = 2.9864797E-6;
    static const double ZES = 0.01675;
    static const double ZNL = 1.5835218E-4;
    static const double C1L = 4.7968065E-7;
    static const double ZEL = 0.05490;
    static const double ZCOSIS = 0.91744867;
    static const double ZSINI = 0.39785416;
    static const double ZSINGS = -0.98088458;
    static const double ZCOSGS = 0.1945905;
    static const double Q22 = 1.7891679E-6;
    static const double Q31 = 2.1460748E-6;
    static const double Q33 = 2.2123015E-7;
    static const double ROOT22 = 1.7891679E-6;
    static const double ROOT32 = 3.7393792E-7;
    static const double ROOT44 = 7.3636953E-9;
    static const double ROOT52 = 1.1428639E-7;
    static const double ROOT54 = 2.1765803E-9;

    const double aqnv = 1.0 / elements_.RecoveredSemiMajorAxis();
    const double xpidot = omgdot + xnodot;
    const double sinq = sin(elements_.AscendingNode());
    const double cosq = cos(elements_.AscendingNode());
    const double sing = sin(elements_.ArgumentPerigee());
    const double cosg = cos(elements_.ArgumentPerigee());

    /*
     * initialize lunar / solar terms
     */
    const double jday = elements_.Epoch().ToJ2000();

    const double xnodce = Util::WrapTwoPI(4.5236020 - 9.2422029e-4 * jday);
    const double stem = sin(xnodce);
    const double ctem = cos(xnodce);
    const double zcosil = 0.91375164 - 0.03568096 * ctem;
    const double zsinil = sqrt(1.0 - zcosil * zcosil);
    const double zsinhl = 0.089683511 * stem / zsinil;
    const double zcoshl = sqrt(1.0 - zsinhl * zsinhl);
    const double c = 4.7199672 + 0.22997150 * jday;
    const double gam = 5.8351514 + 0.0019443680 * jday;
    deepspace_consts_.zmol = Util::WrapTwoPI(c - gam);
    double zx = 0.39785416 * stem / zsinil;
    double zy = zcoshl * ctem + 0.91744867 * zsinhl * stem;
    zx = atan2(zx, zy);
    zx = gam + zx - xnodce;

    const double zcosgl = cos(zx);
    const double zsingl = sin(zx);
    deepspace_consts_.zmos = Util::WrapTwoPI(6.2565837 + 0.017201977 * jday);

    /*
     * do solar terms
     */
    double zcosg = ZCOSGS;
    double zsing = ZSINGS;
    double zcosi = ZCOSIS;
    double zsini = ZSINI;
    double zcosh = cosq;
    double zsinh = sinq;
    double cc = C1SS;
    double zn = ZNS;
    double ze = ZES;
    const double xnoi = 1.0 / elements_.RecoveredMeanMotion();

    for (int cnt = 0; cnt < 2; cnt++)
    {
        /*
         * solar terms are done a second time after lunar terms are done
         */
        const double a1 = zcosg * zcosh + zsing * zcosi * zsinh;
        const double a3 = -zsing * zcosh + zcosg * zcosi * zsinh;
        const double a7 = -zcosg * zsinh + zsing * zcosi * zcosh;
        const double a8 = zsing * zsini;
        const double a9 = zsing * zsinh + zcosg * zcosi*zcosh;
        const double a10 = zcosg * zsini;
        const double a2 = cosio * a7 + sinio * a8;
        const double a4 = cosio * a9 + sinio * a10;
        const double a5 = -sinio * a7 + cosio * a8;
        const double a6 = -sinio * a9 + cosio * a10;
        const double x1 = a1 * cosg + a2 * sing;
        const double x2 = a3 * cosg + a4 * sing;
        const double x3 = -a1 * sing + a2 * cosg;
        const double x4 = -a3 * sing + a4 * cosg;
        const double x5 = a5 * sing;
        const double x6 = a6 * sing;
        const double x7 = a5 * cosg;
        const double x8 = a6 * cosg;
        const double z31 = 12.0 * x1 * x1 - 3. * x3 * x3;
        const double z32 = 24.0 * x1 * x2 - 6. * x3 * x4;
        const double z33 = 12.0 * x2 * x2 - 3. * x4 * x4;
        double z1 = 3.0 * (a1 * a1 + a2 * a2) + z31 * eosq;
        double z2 = 6.0 * (a1 * a3 + a2 * a4) + z32 * eosq;
        double z3 = 3.0 * (a3 * a3 + a4 * a4) + z33 * eosq;

        const double z11 = -6.0 * a1 * a5
            + eosq * (-24. * x1 * x7 - 6. * x3 * x5);
        const double z12 = -6.0 * (a1 * a6 + a3 * a5) 
            + eosq * (-24. * (x2 * x7 + x1 * x8) - 6. * (x3 * x6 + x4 * x5));
        const double z13 = -6.0 * a3 * a6
            + eosq * (-24. * x2 * x8 - 6. * x4 * x6);
        const double z21 = 6.0 * a2 * a5
            + eosq * (24. * x1 * x5 - 6. * x3 * x7);
        const double z22 = 6.0 * (a4 * a5 + a2 * a6)
            + eosq * (24. * (x2 * x5 + x1 * x6) - 6. * (x4 * x7 + x3 * x8));
        const double z23 = 6.0 * a4 * a6
            + eosq * (24. * x2 * x6 - 6. * x4 * x8);

        z1 = z1 + z1 + betao2 * z31;
        z2 = z2 + z2 + betao2 * z32;
        z3 = z3 + z3 + betao2 * z33;

        const double s3 = cc * xnoi;
        const double s2 = -0.5 * s3 / betao;
        const double s4 = s3 * betao;
        const double s1 = -15.0 * elements_.Eccentricity() * s4;
        const double s5 = x1 * x3 + x2 * x4;
        const double s6 = x2 * x3 + x1 * x4;
        const double s7 = x2 * x4 - x1 * x3;

        se = s1 * zn * s5;
        si = s2 * zn * (z11 + z13);
        sl = -zn * s3 * (z1 + z3 - 14.0 - 6.0 * eosq);
        sgh = s4 * zn * (z31 + z33 - 6.0);

        /*
         * replaced
         * sh = -zn * s2 * (z21 + z23
         * with
         * shdq = (-zn * s2 * (z21 + z23)) / sinio
         */
        if (elements_.Inclination() < 5.2359877e-2
                || elements_.Inclination() > kPI - 5.2359877e-2)
        {
            shdq = 0.0;
        }
        else
        {
            shdq = (-zn * s2 * (z21 + z23)) / sinio;
        }

        deepspace_consts_.ee2 = 2.0 * s1 * s6;
        deepspace_consts_.e3 = 2.0 * s1 * s7;
        deepspace_consts_.xi2 = 2.0 * s2 * z12;
        deepspace_consts_.xi3 = 2.0 * s2 * (z13 - z11);
        deepspace_consts_.xl2 = -2.0 * s3 * z2;
        deepspace_consts_.xl3 = -2.0 * s3 * (z3 - z1);
        deepspace_consts_.xl4 = -2.0 * s3 * (-21.0 - 9.0 * eosq) * ze;
        deepspace_consts_.xgh2 = 2.0 * s4 * z32;
        deepspace_consts_.xgh3 = 2.0 * s4 * (z33 - z31);
        deepspace_consts_.xgh4 = -18.0 * s4 * ze;
        deepspace_consts_.xh2 = -2.0 * s2 * z22;
        deepspace_consts_.xh3 = -2.0 * s2 * (z23 - z21);

        if (cnt == 1)
        {
            break;
        }
        /*
         * do lunar terms
         */
        deepspace_consts_.sse = se;
        deepspace_consts_.ssi = si;
        deepspace_consts_.ssl = sl;
        deepspace_consts_.ssh = shdq;
        deepspace_consts_.ssg = sgh - cosio * deepspace_consts_.ssh;
        deepspace_consts_.se2 = deepspace_consts_.ee2;
        deepspace_consts_.si2 = deepspace_consts_.xi2;
        deepspace_consts_.sl2 = deepspace_consts_.xl2;
        deepspace_consts_.sgh2 = deepspace_consts_.xgh2;
        deepspace_consts_.sh2 = deepspace_consts_.xh2;
        deepspace_consts_.se3 = deepspace_consts_.e3;
        deepspace_consts_.si3 = deepspace_consts_.xi3;
        deepspace_consts_.sl3 = deepspace_consts_.xl3;
        deepspace_consts_.sgh3 = deepspace_consts_.xgh3;
        deepspace_consts_.sh3 = deepspace_consts_.xh3;
        deepspace_consts_.sl4 = deepspace_consts_.xl4;
        deepspace_consts_.sgh4 = deepspace_consts_.xgh4;
        zcosg = zcosgl;
        zsing = zsingl;
        zcosi = zcosil;
        zsini = zsinil;
        zcosh = zcoshl * cosq + zsinhl * sinq;
        zsinh = sinq * zcoshl - cosq * zsinhl;
        zn = ZNL;
        cc = C1L;
        ze = ZEL;
    }

    deepspace_consts_.sse += se;
    deepspace_consts_.ssi += si;
    deepspace_consts_.ssl += sl;
    deepspace_consts_.ssg += sgh - cosio * shdq;
    deepspace_consts_.ssh += shdq;

    deepspace_consts_.shape = DeepSpaceConstants::NONE;

    if (elements_.RecoveredMeanMotion() < 0.0052359877
            && elements_.RecoveredMeanMotion() > 0.0034906585)
    {
        /*
         * 24h synchronous resonance terms initialisation
         */
        deepspace_consts_.shape = DeepSpaceConstants::SYNCHRONOUS;

        const double g200 = 1.0 + eosq * (-2.5 + 0.8125 * eosq);
        const double g310 = 1.0 + 2.0 * eosq;
        const double g300 = 1.0 + eosq * (-6.0 + 6.60937 * eosq);
        const double f220 = 0.75 * (1.0 + cosio) * (1.0 + cosio);
        const double f311 = 0.9375 * sinio * sinio * (1.0 + 3.0 * cosio)
            - 0.75 * (1.0 + cosio);
        double f330 = 1.0 + cosio;
        f330 = 1.875 * f330 * f330 * f330;
        deepspace_consts_.del1 = 3.0 * elements_.RecoveredMeanMotion()
            * elements_.RecoveredMeanMotion()
            * aqnv * aqnv;
        deepspace_consts_.del2 = 2.0 * deepspace_consts_.del1
            * f220 * g200 * Q22;
        deepspace_consts_.del3 = 3.0 * deepspace_consts_.del1
            * f330 * g300 * Q33 * aqnv;
        deepspace_consts_.del1 = deepspace_consts_.del1
            * f311 * g310 * Q31 * aqnv;

        deepspace_consts_.xlamo = Util::WrapTwoPI(elements_.MeanAnomoly()
                + elements_.AscendingNode()
                + elements_.ArgumentPerigee()
                - deepspace_consts_.gsto);
        bfact = xmdot + xpidot - kTHDT
            + deepspace_consts_.ssl
            + deepspace_consts_.ssg
            + deepspace_consts_.ssh;
    }
    else if (elements_.RecoveredMeanMotion() < 8.26e-3
            || elements_.RecoveredMeanMotion() > 9.24e-3
            || elements_.Eccentricity() < 0.5)
    {
        // do nothing
    }
    else
    {
        /*
         * geopotential resonance initialisation for 12 hour orbits
         */
        deepspace_consts_.shape = DeepSpaceConstants::RESONANCE;

        double g211;
        double g310;
        double g322;
        double g410;
        double g422;
        double g520;

        double g201 = -0.306 - (elements_.Eccentricity() - 0.64) * 0.440;

        if (elements_.Eccentricity() <= 0.65)
        {
            g211 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    3.616, -13.247, 16.290, 0.0);
            g310 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -19.302, 117.390, -228.419, 156.591);
            g322 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -18.9068, 109.7927, -214.6334, 146.5816);
            g410 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -41.122, 242.694, -471.094, 313.953);
            g422 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -146.407, 841.880, -1629.014, 1083.435);
            g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -532.114, 3017.977, -5740.032, 3708.276);
        }
        else
        {
            g211 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -72.099, 331.819, -508.738, 266.724);
            g310 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -346.844, 1582.851, -2415.925, 1246.113);
            g322 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -342.585, 1554.908, -2366.899, 1215.972);
            g410 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -1052.797, 4758.686, -7193.992, 3651.957);
            g422 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -3581.69, 16178.11, -24462.77, 12422.52);

            if (elements_.Eccentricity() <= 0.715)
            {
                g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                        1464.74, -4664.75, 3763.64, 0.0);
            }
            else
            {
                g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                        -5149.66, 29936.92, -54087.36, 31324.56);
            }
        }

        double g533;
        double g521;
        double g532;

        if (elements_.Eccentricity() < 0.7)
        {
            g533 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -919.2277, 4988.61, -9064.77, 5542.21);
            g521 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -822.71072, 4568.6173, -8491.4146, 5337.524);
            g532 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -853.666, 4690.25, -8624.77, 5341.4);
        }
        else
        {
            g533 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -37995.78, 161616.52, -229838.2, 109377.94);
            g521 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -51752.104, 218913.95, -309468.16, 146349.42);
            g532 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -40023.88, 170470.89, -242699.48, 115605.82);
        }

        const double sini2 = sinio * sinio;
        const double f220 = 0.75 * (1.0 + 2.0 * cosio + theta2);
        const double f221 = 1.5 * sini2;
        const double f321 = 1.875 * sinio * (1.0 - 2.0 * cosio - 3.0 * theta2);
        const double f322 = -1.875 * sinio * (1.0 + 2.0 * cosio - 3.0 * theta2);
        const double f441 = 35.0 * sini2 * f220;
        const double f442 = 39.3750 * sini2 * sini2;
        const double f522 = 9.84375 * sinio
            * (sini2 * (1.0 - 2.0 * cosio - 5.0 * theta2)
                + 0.33333333 * (-2.0 + 4.0 * cosio + 6.0 * theta2));
        const double f523 = sinio
            * (4.92187512 * sini2 * (-2.0 - 4.0 * cosio + 10.0 * theta2)
                + 6.56250012 * (1.0 + 2.0 * cosio - 3.0 * theta2));
        const double f542 = 29.53125 * sinio * (2.0 - 8.0 * cosio + theta2 *
                (-12.0 + 8.0 * cosio + 10.0 * theta2));
        const double f543 = 29.53125 * sinio * (-2.0 - 8.0 * cosio + theta2 *
                (12.0 + 8.0 * cosio - 10.0 * theta2));

        const double xno2 = elements_.RecoveredMeanMotion()
            * elements_.RecoveredMeanMotion();
        const double ainv2 = aqnv * aqnv;

        double temp1 = 3.0 * xno2 * ainv2;
        double temp = temp1 * ROOT22;
        deepspace_consts_.d2201 = temp * f220 * g201;
        deepspace_consts_.d2211 = temp * f221 * g211;

        temp1 *= aqnv;
        temp = temp1 * ROOT32;
        deepspace_consts_.d3210 = temp * f321 * g310;
        deepspace_consts_.d3222 = temp * f322 * g322;

        temp1 *= aqnv;
        temp = 2.0 * temp1 * ROOT44;
        deepspace_consts_.d4410 = temp * f441 * g410;
        deepspace_consts_.d4422 = temp * f442 * g422;

        temp1 *= aqnv;
        temp = temp1 * ROOT52;
        deepspace_consts_.d5220 = temp * f522 * g520;
        deepspace_consts_.d5232 = temp * f523 * g532;

        temp = 2.0 * temp1 * ROOT54;
        deepspace_consts_.d5421 = temp * f542 * g521;
        deepspace_consts_.d5433 = temp * f543 * g533;

        deepspace_consts_.xlamo = Util::WrapTwoPI(
                elements_.MeanAnomoly()
                + elements_.AscendingNode()
                + elements_.AscendingNode()
                - deepspace_consts_.gsto
                - deepspace_consts_.gsto);
        bfact = xmdot
            + xnodot + xnodot
            - kTHDT - kTHDT
            + deepspace_consts_.ssl
            + deepspace_consts_.ssh
            + deepspace_consts_.ssh;
    }

    if (deepspace_consts_.shape != DeepSpaceConstants::NONE)
    {
        /*
         * initialise integrator
         */
        deepspace_consts_.xfact = bfact - elements_.RecoveredMeanMotion();
        integrator_params_.atime = 0.0;
        integrator_params_.xni = elements_.RecoveredMeanMotion();
        integrator_params_.xli = deepspace_consts_.xlamo;
    }
}